

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int callback_cancel(uint id)

{
  int pi;
  callback_t *pcVar1;
  callback_t *pcVar2;
  callback_t **ppcVar3;
  callback_t *__ptr;
  
  __ptr = gCallBackFirst;
  if (gCallBackFirst != (callback_t *)0x0) {
    do {
      if (__ptr->id == id) {
        pi = __ptr->pi;
        pcVar1 = __ptr->prev;
        ppcVar3 = &gCallBackFirst;
        if (pcVar1 != (callback_t *)0x0) {
          ppcVar3 = &pcVar1->next;
        }
        pcVar2 = __ptr->next;
        *ppcVar3 = pcVar2;
        ppcVar3 = &gCallBackLast;
        if (pcVar2 != (callback_t *)0x0) {
          ppcVar3 = &pcVar2->prev;
        }
        *ppcVar3 = pcVar1;
        free(__ptr);
        findNotifyBits(pi);
        return 0;
      }
      ppcVar3 = &__ptr->next;
      __ptr = *ppcVar3;
    } while (*ppcVar3 != (callback_t *)0x0);
  }
  return -0x7da;
}

Assistant:

int callback_cancel(unsigned id)
{
   callback_t *p;
   int pi;

   p = gCallBackFirst;

   while (p)
   {
      if (p->id == id)
      {
         pi = p->pi;

         if (p->prev) {p->prev->next = p->next;}
         else         {gCallBackFirst = p->next;}

         if (p->next) {p->next->prev = p->prev;}
         else         {gCallBackLast = p->prev;}

         free(p);

         findNotifyBits(pi);

         return 0;
      }
      p = p->next;
   }
   return pigif_callback_not_found;
}